

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.c
# Opt level: O2

int yaml_emitter_emit_document_start(yaml_emitter_t *emitter,yaml_event_t *event,int first)

{
  byte bVar1;
  yaml_char_t *pyVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  byte *pbVar6;
  char *pcVar7;
  yaml_version_directive_t *pyVar8;
  byte *__s;
  yaml_tag_directive_t *pyVar9;
  long *plVar10;
  yaml_tag_directive_t yVar11;
  
  if (event->type == YAML_STREAM_END_EVENT) {
    iVar3 = yaml_emitter_flush(emitter);
    if (iVar3 != 0) {
      emitter->state = YAML_EMIT_END_STATE;
      return 1;
    }
  }
  else {
    if (event->type == YAML_DOCUMENT_START_EVENT) {
      pyVar8 = (event->data).document_start.version_directive;
      if ((pyVar8 == (yaml_version_directive_t *)0x0) ||
         (*pyVar8 == (yaml_version_directive_t)0x100000001)) {
        pyVar9 = (event->data).document_start.tag_directives.start;
        do {
          if (pyVar9 == (event->data).document_start.tag_directives.end) {
            plVar10 = &DAT_0011dd90;
            while ((yaml_char_t *)*plVar10 != (yaml_char_t *)0x0) {
              yVar11.prefix = (yaml_char_t *)plVar10[1];
              yVar11.handle = (yaml_char_t *)*plVar10;
              iVar3 = yaml_emitter_append_tag_directive(emitter,yVar11,1);
              plVar10 = plVar10 + 2;
              if (iVar3 == 0) {
                return 0;
              }
            }
            if ((first == 0) || (emitter->canonical != 0)) {
              iVar3 = 0;
            }
            else {
              iVar3 = (event->data).document_start.implicit;
            }
            pyVar8 = (event->data).document_start.version_directive;
            if ((pyVar8 != (yaml_version_directive_t *)0x0) ||
               ((event->data).document_start.tag_directives.start !=
                (event->data).document_start.tag_directives.end)) {
              if (emitter->open_ended != 0) {
                iVar4 = yaml_emitter_write_indicator(emitter,"...",1,0,0);
                if (iVar4 == 0) {
                  return 0;
                }
                iVar4 = yaml_emitter_write_indent(emitter);
                if (iVar4 == 0) {
                  return 0;
                }
                pyVar8 = (event->data).document_start.version_directive;
              }
              if (pyVar8 != (yaml_version_directive_t *)0x0) {
                iVar3 = yaml_emitter_write_indicator(emitter,"%YAML",1,0,0);
                if (iVar3 == 0) {
                  return 0;
                }
                iVar3 = yaml_emitter_write_indicator(emitter,"1.1",1,0,0);
                if (iVar3 == 0) {
                  return 0;
                }
                iVar4 = yaml_emitter_write_indent(emitter);
                iVar3 = 0;
                if (iVar4 == 0) {
                  return 0;
                }
              }
            }
            pyVar9 = (event->data).document_start.tag_directives.start;
            if (pyVar9 == (event->data).document_start.tag_directives.end) {
              if (iVar3 != 0) goto LAB_00106ec8;
            }
            else {
              while (pyVar9 != (event->data).document_start.tag_directives.end) {
                iVar3 = yaml_emitter_write_indicator(emitter,"%TAG",1,0,0);
                if (iVar3 == 0) {
                  return 0;
                }
                pyVar2 = pyVar9->handle;
                sVar5 = strlen((char *)pyVar2);
                iVar3 = yaml_emitter_write_tag_handle(emitter,pyVar2,sVar5);
                if (iVar3 == 0) {
                  return 0;
                }
                pyVar2 = pyVar9->prefix;
                sVar5 = strlen((char *)pyVar2);
                iVar3 = yaml_emitter_write_tag_content(emitter,pyVar2,sVar5,1);
                if (iVar3 == 0) {
                  return 0;
                }
                iVar3 = yaml_emitter_write_indent(emitter);
                pyVar9 = pyVar9 + 1;
                if (iVar3 == 0) {
                  return 0;
                }
              }
            }
            iVar3 = yaml_emitter_write_indent(emitter);
            if (iVar3 == 0) {
              return 0;
            }
            iVar3 = yaml_emitter_write_indicator(emitter,"---",1,0,0);
            if (iVar3 == 0) {
              return 0;
            }
            if ((emitter->canonical != 0) &&
               (iVar3 = yaml_emitter_write_indent(emitter), iVar3 == 0)) {
              return 0;
            }
LAB_00106ec8:
            emitter->state = YAML_EMIT_DOCUMENT_CONTENT_STATE;
            return 1;
          }
          __s = pyVar9->handle;
          pyVar2 = pyVar9->prefix;
          yVar11 = *pyVar9;
          sVar5 = strlen((char *)__s);
          if (sVar5 == 0) {
            pcVar7 = "tag handle must not be empty";
LAB_00106ccb:
            emitter->error = YAML_EMITTER_ERROR;
            goto LAB_00106ce0;
          }
          if (*__s != 0x21) {
            pcVar7 = "tag handle must start with \'!\'";
            goto LAB_00106ccb;
          }
          if (__s[sVar5 - 1] != 0x21) {
            pcVar7 = "tag handle must end with \'!\'";
            goto LAB_00106ccb;
          }
          pbVar6 = __s + (sVar5 - 1);
          while (__s = __s + 1, __s < pbVar6) {
            bVar1 = *__s;
            if ((((9 < (byte)(bVar1 - 0x30)) && (0x19 < (byte)((bVar1 & 0xdf) + 0xbf))) &&
                (bVar1 != 0x5f)) && (bVar1 != 0x2d)) {
              pcVar7 = "tag handle must contain alphanumerical characters only";
              goto LAB_00106ccb;
            }
          }
          if (*pyVar2 == '\0') {
            pcVar7 = "tag prefix must not be empty";
            goto LAB_00106ccb;
          }
          iVar3 = yaml_emitter_append_tag_directive(emitter,yVar11,0);
          pyVar9 = pyVar9 + 1;
          if (iVar3 == 0) {
            return 0;
          }
        } while( true );
      }
      emitter->error = YAML_EMITTER_ERROR;
      pcVar7 = "incompatible %YAML directive";
    }
    else {
      emitter->error = YAML_EMITTER_ERROR;
      pcVar7 = "expected DOCUMENT-START or STREAM-END";
    }
LAB_00106ce0:
    emitter->problem = pcVar7;
  }
  return 0;
}

Assistant:

static int
yaml_emitter_emit_document_start(yaml_emitter_t *emitter,
        yaml_event_t *event, int first)
{
    if (event->type == YAML_DOCUMENT_START_EVENT)
    {
        yaml_tag_directive_t default_tag_directives[] = {
            {(yaml_char_t *)"!", (yaml_char_t *)"!"},
            {(yaml_char_t *)"!!", (yaml_char_t *)"tag:yaml.org,2002:"},
            {NULL, NULL}
        };
        yaml_tag_directive_t *tag_directive;
        int implicit;

        if (event->data.document_start.version_directive) {
            if (!yaml_emitter_analyze_version_directive(emitter,
                        *event->data.document_start.version_directive))
                return 0;
        }

        for (tag_directive = event->data.document_start.tag_directives.start;
                tag_directive != event->data.document_start.tag_directives.end;
                tag_directive ++) {
            if (!yaml_emitter_analyze_tag_directive(emitter, *tag_directive))
                return 0;
            if (!yaml_emitter_append_tag_directive(emitter, *tag_directive, 0))
                return 0;
        }

        for (tag_directive = default_tag_directives;
                tag_directive->handle; tag_directive ++) {
            if (!yaml_emitter_append_tag_directive(emitter, *tag_directive, 1))
                return 0;
        }

        implicit = event->data.document_start.implicit;
        if (!first || emitter->canonical) {
            implicit = 0;
        }

        if ((event->data.document_start.version_directive ||
                    (event->data.document_start.tag_directives.start
                     != event->data.document_start.tag_directives.end)) &&
                emitter->open_ended)
        {
            if (!yaml_emitter_write_indicator(emitter, "...", 1, 0, 0))
                return 0;
            if (!yaml_emitter_write_indent(emitter))
                return 0;
        }

        if (event->data.document_start.version_directive) {
            implicit = 0;
            if (!yaml_emitter_write_indicator(emitter, "%YAML", 1, 0, 0))
                return 0;
            if (!yaml_emitter_write_indicator(emitter, "1.1", 1, 0, 0))
                return 0;
            if (!yaml_emitter_write_indent(emitter))
                return 0;
        }

        if (event->data.document_start.tag_directives.start
                != event->data.document_start.tag_directives.end) {
            implicit = 0;
            for (tag_directive = event->data.document_start.tag_directives.start;
                    tag_directive != event->data.document_start.tag_directives.end;
                    tag_directive ++) {
                if (!yaml_emitter_write_indicator(emitter, "%TAG", 1, 0, 0))
                    return 0;
                if (!yaml_emitter_write_tag_handle(emitter, tag_directive->handle,
                            strlen((char *)tag_directive->handle)))
                    return 0;
                if (!yaml_emitter_write_tag_content(emitter, tag_directive->prefix,
                            strlen((char *)tag_directive->prefix), 1))
                    return 0;
                if (!yaml_emitter_write_indent(emitter))
                    return 0;
            }
        }

        if (yaml_emitter_check_empty_document(emitter)) {
            implicit = 0;
        }

        if (!implicit) {
            if (!yaml_emitter_write_indent(emitter))
                return 0;
            if (!yaml_emitter_write_indicator(emitter, "---", 1, 0, 0))
                return 0;
            if (emitter->canonical) {
                if (!yaml_emitter_write_indent(emitter))
                    return 0;
            }
        }

        emitter->state = YAML_EMIT_DOCUMENT_CONTENT_STATE;

        return 1;
    }

    else if (event->type == YAML_STREAM_END_EVENT)
    {

        if (!yaml_emitter_flush(emitter))
            return 0;

        emitter->state = YAML_EMIT_END_STATE;

        return 1;
    }

    return yaml_emitter_set_emitter_error(emitter,
            "expected DOCUMENT-START or STREAM-END");
}